

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

void __thiscall
Enterprise::ConcreteMachine<false,_true>::advance_nick
          (ConcreteMachine<false,_true> *this,HalfCycles duration)

{
  bool bVar1;
  Nick *this_00;
  HalfCycles offset;
  bool nick_interrupt_line;
  Nick *nick;
  ConcreteMachine<false,_true> *this_local;
  HalfCycles duration_local;
  
  bVar1 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_13478201,_5680000>::operator+=
                    (&this->nick_,duration);
  if (bVar1) {
    this_00 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_13478201,_5680000>::last_valid
                        (&this->nick_);
    bVar1 = Nick::get_interrupt_line(this_00);
    if ((bVar1) && ((this->previous_nick_interrupt_line_ & 1U) == 0)) {
      offset = JustInTimeActor<Enterprise::Nick,_HalfCycles,_13478201,_5680000>::
               last_sequence_point_overrun(&this->nick_);
      set_interrupts(this,' ',offset);
    }
    this->previous_nick_interrupt_line_ = bVar1;
  }
  return;
}

Assistant:

forceinline void advance_nick(HalfCycles duration) {
			if(nick_ += duration) {
				const auto nick = nick_.last_valid();
				const bool nick_interrupt_line = nick->get_interrupt_line();
				if(nick_interrupt_line && !previous_nick_interrupt_line_) {
					set_interrupts(uint8_t(Dave::Interrupt::Nick), nick_.last_sequence_point_overrun());
				}
				previous_nick_interrupt_line_ = nick_interrupt_line;
			}
		}